

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer.cpp
# Opt level: O2

void __thiscall mjs::print_visitor::operator()(print_visitor *this,block_statement *s)

{
  pointer puVar1;
  unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_> *bs;
  pointer puVar2;
  
  std::operator<<(this->os_,'{');
  puVar1 = (s->l_).
           super__Vector_base<std::unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>,_std::allocator<std::unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (puVar2 = (s->l_).
                super__Vector_base<std::unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>,_std::allocator<std::unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; puVar2 != puVar1; puVar2 = puVar2 + 1) {
    accept<mjs::print_visitor>
              ((puVar2->_M_t).
               super___uniq_ptr_impl<mjs::statement,_std::default_delete<mjs::statement>_>._M_t.
               super__Tuple_impl<0UL,_mjs::statement_*,_std::default_delete<mjs::statement>_>.
               super__Head_base<0UL,_mjs::statement_*,_false>._M_head_impl,this);
  }
  std::operator<<(this->os_,'}');
  return;
}

Assistant:

void operator()(const block_statement& s) {
        os_ << '{';
        for (const auto& bs: s.l()) {
            accept(*bs, *this);
        }
        os_ << '}';
    }